

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_solver.c
# Opt level: O0

void PDHG_Compute_Dual_Feasibility
               (CUPDLPwork *work,cupdlp_float *dualResidual,cupdlp_float *aty,cupdlp_float *x,
               cupdlp_float *y,cupdlp_float *dDualFeasibility,cupdlp_float *dDualObj,
               cupdlp_float *dComplementarity,cupdlp_float *dSlackPos,cupdlp_float *dSlackNeg)

{
  long *plVar1;
  long lVar2;
  void *in_RDX;
  void *in_RSI;
  long *in_RDI;
  ulong *in_R9;
  cupdlp_int index;
  cupdlp_float temp;
  cupdlp_float alpha;
  CUPDLPscaling *scaling;
  CUPDLPresobj *resobj;
  CUPDLPdata *lp;
  CUPDLPproblem *problem;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  cupdlp_float *in_stack_ffffffffffffffa0;
  cupdlp_float *x_00;
  undefined8 in_stack_ffffffffffffffa8;
  cupdlp_float weight;
  cupdlp_int cVar3;
  CUPDLPwork *w;
  
  plVar1 = (long *)*in_RDI;
  lVar2 = *plVar1;
  w = (CUPDLPwork *)in_RDI[5];
  cupdlp_dot(w,(cupdlp_int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),in_stack_ffffffffffffffa0,
             (cupdlp_float *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             (cupdlp_float *)0x7fd9b6);
  memcpy(in_RSI,in_RDX,(long)*(int *)(lVar2 + 4) << 3);
  cupdlp_scaleVector(w,-1.0,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  weight = 1.0;
  cupdlp_axpy(w,0x3ff00000,in_stack_ffffffffffffffa0,
              (cupdlp_float *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
              (cupdlp_float *)0x7fda30);
  memcpy(scaling,in_RSI,(long)*(int *)(lVar2 + 4) << 3);
  cupdlp_projPos(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  cupdlp_edot(in_stack_ffffffffffffffa0,
              (cupdlp_float *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
  x_00 = (cupdlp_float *)0x0;
  cupdlp_dot(w,(cupdlp_int)((ulong)weight >> 0x20),(cupdlp_float *)0x0,
             (cupdlp_float *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             (cupdlp_float *)0x7fdab3);
  *(double *)temp = (double)x_00 + *(double *)temp;
  memcpy(resobj,in_RSI,(long)*(int *)(lVar2 + 4) << 3);
  cupdlp_projNeg(x_00,in_stack_ffffffffffffff9c);
  cupdlp_scaleVector(w,weight,x_00,in_stack_ffffffffffffff9c);
  cVar3 = (cupdlp_int)((ulong)weight >> 0x20);
  cupdlp_edot(x_00,(cupdlp_float *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
  cupdlp_dot(w,cVar3,x_00,
             (cupdlp_float *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             (cupdlp_float *)0x7fdb62);
  *(double *)temp = *(double *)temp - (double)x_00;
  *(double *)temp = *(double *)temp * (double)plVar1[0xd] + (double)plVar1[0xc];
  cupdlp_axpy(w,-0x40100000,x_00,
              (cupdlp_float *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
              (cupdlp_float *)0x7fdbd9);
  cVar3 = 0x3ff00000;
  cupdlp_axpy(w,0x3ff00000,x_00,
              (cupdlp_float *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
              (cupdlp_float *)0x7fdc0b);
  if (*(int *)&w->problem != 0) {
    cupdlp_edot(x_00,(cupdlp_float *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0
               );
  }
  if (*(int *)(in_RDI[1] + 0x28) == 0) {
    cupdlp_twoNorm(w,cVar3,x_00,
                   (cupdlp_float *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  }
  else {
    cupdlp_infNormIndex(w,cVar3,x_00,
                        (cupdlp_int *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98))
    ;
    *in_R9 = *(ulong *)((long)in_RSI + (long)in_stack_ffffffffffffff9c * 8) & 0x7fffffffffffffff;
  }
  return;
}

Assistant:

void PDHG_Compute_Dual_Feasibility(CUPDLPwork *work, cupdlp_float *dualResidual,
                                   const cupdlp_float *aty, const cupdlp_float *x,
                                   const cupdlp_float *y, cupdlp_float *dDualFeasibility,
                                   cupdlp_float *dDualObj, cupdlp_float *dComplementarity,
                                   cupdlp_float *dSlackPos, cupdlp_float *dSlackNeg) {
  CUPDLPproblem *problem = work->problem;
  CUPDLPdata *lp = problem->data;
  CUPDLPresobj *resobj = work->resobj;
  CUPDLPscaling *scaling = work->scaling;
  // todo, compute Neumaier
  //    *dDualObj = Dotprod_Neumaier(problem->rhs, y, lp->nRows);
  cupdlp_dot(work, lp->nRows, y, problem->rhs, dDualObj);

  #if !defined(CUPDLP_CPU) && USE_KERNELS
  dualResidual = work->buffer2;

  cupdlp_float alpha;
  cupdlp_dual_feasibility_kernel_1_cuda(dualResidual, aty,
                                        problem->cost, lp->nCols);

  cupdlp_dual_feasibility_kernel_2_cuda(dSlackPos, dualResidual,
                                        problem->hasLower, lp->nCols);

  cupdlp_float temp = 0.0;
  cupdlp_dot(work, lp->nCols, dSlackPos, resobj->dLowerFiltered, &temp);
  *dDualObj += temp;

  cupdlp_dual_feasibility_kernel_3_cuda(dSlackNeg, dualResidual,
                                        problem->hasUpper, lp->nCols);

  cupdlp_dot(work, lp->nCols, dSlackNeg, resobj->dUpperFiltered, &temp);
  *dDualObj -= temp;

  *dDualObj = *dDualObj * problem->sense_origin + problem->offset;

  alpha = -1.0;
  cupdlp_axpy(work, lp->nCols, &alpha, dSlackPos, dualResidual);
  alpha = 1.0;
  cupdlp_axpy(work, lp->nCols, &alpha, dSlackNeg, dualResidual);

  if (scaling->ifScaled) {
    cupdlp_edot(dualResidual, work->colScale, lp->nCols);
  }
  cupdlp_twoNorm(work, lp->nCols, dualResidual, dDualFeasibility);

#else
  // *dComplementarity = 0.0;

  // @note:
  // original dual residual in pdlp:
  // they compute:
  //    violation   +  reduced cost
  //  |max(-y, 0)|  + |(I-\Pi)(c-Α'\nu)|
  // compute c - A'y

  CUPDLP_COPY_VEC(dualResidual, aty, cupdlp_float, lp->nCols);
  cupdlp_float alpha = -1.0;
  cupdlp_scaleVector(work, alpha, dualResidual, lp->nCols);

  alpha = 1.0;
  cupdlp_axpy(work, lp->nCols, &alpha, problem->cost, dualResidual);

  //    julia version
  //        function compute_reduced_costs_from_primal_gradient_kernel!(
  //            primal_gradient::CuDeviceVector{Float64},
  //            isfinite_variable_lower_bound::CuDeviceVector{Bool},
  //            isfinite_variable_upper_bound::CuDeviceVector{Bool},
  //            num_variables::Int64,
  //            reduced_costs::CuDeviceVector{Float64},
  //            reduced_costs_violation::CuDeviceVector{Float64},
  //        )
  //            tx = threadIdx().x + (blockDim().x * (blockIdx().x - 0x1))
  //            if tx <= num_variables
  //                @inbounds begin
  //                    reduced_costs[tx] = max(primal_gradient[tx], 0.0) *
  //                    isfinite_variable_lower_bound[tx] +
  //                    min(primal_gradient[tx], 0.0) *
  //                    isfinite_variable_upper_bound[tx]
  //
  //                    reduced_costs_violation[tx] = primal_gradient[tx] -
  //                    reduced_costs[tx]
  //                end
  //            end
  //            return
  //        end

  CUPDLP_COPY_VEC(dSlackPos, dualResidual, cupdlp_float, lp->nCols);

  cupdlp_projPos(dSlackPos, lp->nCols);

  cupdlp_edot(dSlackPos, problem->hasLower, lp->nCols);

  cupdlp_float temp = 0.0;
  // cupdlp_dot(work, lp->nCols, x, dSlackPos, &temp);
  // *dComplementarity += temp;
  // cupdlp_dot(work, lp->nCols, dSlackPos, resobj->dLowerFiltered, &temp);
  // *dComplementarity -= temp;
  cupdlp_dot(work, lp->nCols, dSlackPos, resobj->dLowerFiltered, &temp);
  *dDualObj += temp;

  CUPDLP_COPY_VEC(dSlackNeg, dualResidual, cupdlp_float, lp->nCols);

  cupdlp_projNeg(dSlackNeg, lp->nCols);

  cupdlp_scaleVector(work, -1.0, dSlackNeg, lp->nCols);

  cupdlp_edot(dSlackNeg, problem->hasUpper, lp->nCols);

  // cupdlp_dot(work, lp->nCols, x, dSlackNeg, &temp);
  // *dComplementarity -= temp;
  // cupdlp_dot(work, lp->nCols, dSlackNeg, resobj->dUpperFiltered, &temp);
  // *dComplementarity += temp;
  cupdlp_dot(work, lp->nCols, dSlackNeg, resobj->dUpperFiltered, &temp);
  *dDualObj -= temp;

  *dDualObj = *dDualObj * problem->sense_origin + problem->offset;

  alpha = -1.0;
  cupdlp_axpy(work, lp->nCols, &alpha, dSlackPos, dualResidual);
  alpha = 1.0;
  cupdlp_axpy(work, lp->nCols, &alpha, dSlackNeg, dualResidual);

  if (scaling->ifScaled) {
    // cupdlp_edot(dualResidual, scaling->colScale, lp->nCols);
    // cupdlp_edot(dualResidual, scaling->colScale_gpu, lp->nCols);

    // cupdlp_copy_vec(work->buffer3, scaling->colScale, cupdlp_float,
    // lp->nCols); cupdlp_edot(dualResidual, work->buffer3, lp->nCols);

    cupdlp_edot(dualResidual, work->colScale, lp->nCols);
  }

  if (work->settings->iInfNormAbsLocalTermination) {
    cupdlp_int index;
    cupdlp_infNormIndex(work, lp->nCols, dualResidual, &index);
    *dDualFeasibility = fabs(dualResidual[index]);

// WIP only allow native for the moment
// #ifdef CUPDLP_CPU
//     *dDualFeasibility = fabs(dualResidual[index]);
// #else
//     double res_value = get_fabs_value(dualResidual, index, lp->nCols);
//     *dDualFeasibility = fabs(res_value);   
// #endif

  } else {
    cupdlp_twoNorm(work, lp->nCols, dualResidual, dDualFeasibility);
  }

#endif
}